

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

void Prs_ManWriteVerilog(char *pFileName,Vec_Ptr_t *vPrs)

{
  int iVar1;
  Prs_Ntk_t *pPVar2;
  FILE *__stream;
  char *pcVar3;
  char *pcVar4;
  FILE *pFile;
  int i;
  Prs_Ntk_t *pNtk;
  char *pTypeNames [90];
  Vec_Ptr_t *vPrs_local;
  char *pFileName_local;
  
  pTypeNames[0x59] = (char *)vPrs;
  pPVar2 = Prs_ManRoot(vPrs);
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
  }
  else {
    Cba_ManCreatePrimMap((char **)&pNtk);
    pcVar3 = Prs_NtkStr(pPVar2,pPVar2->iModuleName);
    pcVar4 = Extra_TimeStamp();
    fprintf(__stream,"// Design \"%s\" written by ABC on %s\n\n",pcVar3,pcVar4);
    for (pFile._4_4_ = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pTypeNames[0x59]), pFile._4_4_ < iVar1;
        pFile._4_4_ = pFile._4_4_ + 1) {
      pPVar2 = (Prs_Ntk_t *)Vec_PtrEntry((Vec_Ptr_t *)pTypeNames[0x59],pFile._4_4_);
      Prs_ManWriteVerilogNtk((FILE *)__stream,pPVar2,(char **)&pNtk);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void Prs_ManWriteVerilog( char * pFileName, Vec_Ptr_t * vPrs )
{
    char * pTypeNames[CBA_BOX_LAST];
    Prs_Ntk_t * pNtk = Prs_ManRoot(vPrs); int i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    Cba_ManCreatePrimMap( pTypeNames );
    fprintf( pFile, "// Design \"%s\" written by ABC on %s\n\n", Prs_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Prs_Ntk_t *, vPrs, pNtk, i )
        Prs_ManWriteVerilogNtk( pFile, pNtk, pTypeNames );
    fclose( pFile );
}